

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int doctest::detail::suiteOrderComparator(void *a,void *b)

{
  int iVar1;
  
  iVar1 = strcmp((char *)**a,(char *)**b);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = fileOrderComparator(a,b);
  return iVar1;
}

Assistant:

int suiteOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);

        int res = strcmp(lhs->m_suite, rhs->m_suite);
        if(res != 0)
            return res;
        return fileOrderComparator(a, b);
    }